

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordering.h
# Opt level: O1

Expression *
wasm::getResultOfFirst
          (Expression *first,Expression *second,Function *func,Module *wasm,PassOptions *passOptions
          )

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Index index;
  Drop *this;
  Block *pBVar4;
  Expression *this_00;
  ulong extraout_RDX;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  LocalSet *local_60;
  Expression *local_58;
  undefined1 *local_50;
  initializer_list<wasm::Expression_*> local_48;
  Builder local_38;
  Builder builder;
  
  if ((first->type).id < 2) {
    __assert_fail("first->type.isConcrete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ordering.h"
                  ,0x2f,
                  "Expression *wasm::getResultOfFirst(Expression *, Expression *, Function *, Module *, const PassOptions &)"
                 );
  }
  local_38.wasm = wasm;
  if ((second->type).id == 1) {
    this_00 = (Expression *)&wasm->allocator;
    this = (Drop *)MixedArena::allocSpace((MixedArena *)this_00,0x18,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (this->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    this->value = first;
    Drop::finalize(this);
    first = second;
    second = (Expression *)this;
  }
  else {
    this_00 = second;
    bVar3 = EffectAnalyzer::canReorder(passOptions,wasm,first,second);
    if (!bVar3) {
      uVar1 = (first->type).id;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      index = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar2 << 0x40),
                              (Type)passOptions);
      local_60 = Builder::makeLocalSet(&local_38,index,first);
      local_58 = second;
      local_50 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *local_50 = 8;
      *(Index *)(local_50 + 0x10) = index;
      *(ulong *)(local_50 + 8) = uVar1;
      local_48._M_len = 3;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX
      ;
      local_48._M_array = (iterator)&local_60;
      pBVar4 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                         (&local_38,&local_48,type);
      return (Expression *)pBVar4;
    }
  }
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)this_00;
  pBVar4 = Builder::makeSequence(&local_38,second,first,type_00);
  return (Expression *)pBVar4;
}

Assistant:

inline Expression* getResultOfFirst(Expression* first,
                                    Expression* second,
                                    Function* func,
                                    Module* wasm,
                                    const PassOptions& passOptions) {
  assert(first->type.isConcrete());

  Builder builder(*wasm);

  if (second->type == Type::unreachable) {
    // No value is actually consumed here. Emit something with unreachable type.
    // (Note that if we continued to the canReorder code after us, and emitted
    // second followed by first, then the block would have a concrete type due
    // to the last element having such a type - which would not have unreachable
    // type.)
    return builder.makeSequence(builder.makeDrop(first), second);
  }

  if (EffectAnalyzer::canReorder(passOptions, *wasm, first, second)) {
    return builder.makeSequence(second, first);
  }

  auto type = first->type;
  auto index = Builder::addVar(func, type);
  return builder.makeBlock({builder.makeLocalSet(index, first),
                            second,
                            builder.makeLocalGet(index, type)});
}